

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

_Bool cf_socket_conn_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  int iVar1;
  int local_38;
  int r;
  pollfd pfd [1];
  cf_socket_ctx *ctx;
  _Bool *input_pending_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pfd[0] = (pollfd)cf->ctx;
  *input_pending = false;
  if ((pfd[0] == (pollfd)0x0) || (*(int *)((long)pfd[0] + 0x98) == -1)) {
    cf_local._7_1_ = false;
  }
  else {
    local_38 = *(int *)((long)pfd[0] + 0x98);
    r._0_2_ = 0xc3;
    r._2_2_ = 0;
    iVar1 = Curl_poll((pollfd *)&stack0xffffffffffffffc8,1,0);
    if (iVar1 < 0) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"is_alive: poll error, assume dead");
      }
      cf_local._7_1_ = false;
    }
    else if (iVar1 == 0) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"is_alive: poll timeout, assume alive");
      }
      cf_local._7_1_ = true;
    }
    else if ((r._2_2_ & 0x3a) == 0) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"is_alive: valid events, looks alive");
      }
      *input_pending = true;
      cf_local._7_1_ = true;
    }
    else {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"is_alive: err/hup/etc events, assume dead");
      }
      cf_local._7_1_ = false;
    }
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_socket_conn_is_alive(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool *input_pending)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  struct pollfd pfd[1];
  int r;

  *input_pending = FALSE;
  (void)data;
  if(!ctx || ctx->sock == CURL_SOCKET_BAD)
    return FALSE;

  /* Check with 0 timeout if there are any events pending on the socket */
  pfd[0].fd = ctx->sock;
  pfd[0].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
  pfd[0].revents = 0;

  r = Curl_poll(pfd, 1, 0);
  if(r < 0) {
    CURL_TRC_CF(data, cf, "is_alive: poll error, assume dead");
    return FALSE;
  }
  else if(r == 0) {
    CURL_TRC_CF(data, cf, "is_alive: poll timeout, assume alive");
    return TRUE;
  }
  else if(pfd[0].revents & (POLLERR|POLLHUP|POLLPRI|POLLNVAL)) {
    CURL_TRC_CF(data, cf, "is_alive: err/hup/etc events, assume dead");
    return FALSE;
  }

  CURL_TRC_CF(data, cf, "is_alive: valid events, looks alive");
  *input_pending = TRUE;
  return TRUE;
}